

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

size_t __thiscall
merlin::config_index::convert
          (config_index *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *config)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  pointer ppVar4;
  reference pvVar5;
  size_type sVar6;
  int local_84;
  ulong uStack_80;
  int i_2;
  size_t i_1;
  size_t offset;
  size_t index;
  size_t val;
  _Self local_58;
  iterator mi;
  size_t var;
  size_t i;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *config_local;
  config_index *this_local;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)config;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  sVar3 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::size(&this->m_vars);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,sVar3);
  for (var = 0; sVar3 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::size
                                  (&this->m_vars), var < sVar3; var = var + 1) {
    this_00 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::operator[]
                        (&this->m_vars,var);
    mi._M_node = (_Base_ptr)variable::label(this_00);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(key_type *)&mi);
    val = (size_t)std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::end((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_58,(_Self *)&val);
    if (bVar2) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&local_58);
      uVar1 = ppVar4->second;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,var);
      *pvVar5 = uVar1;
    }
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  sVar6 = std::vector<merlin::variable,_std::allocator<merlin::variable>_>::size(&this->m_vars);
  if (sVar3 != sVar6) {
    __assert_fail("values.size() == m_vars.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/index.h"
                  ,0x255,"size_t merlin::config_index::convert(std::map<size_t, size_t> &)");
  }
  offset = 0;
  i_1 = 1;
  if ((this->m_bigendian & 1U) == 0) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_dims);
    local_84 = (int)sVar3;
    while (local_84 = local_84 + -1, -1 < local_84) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                          (long)local_84);
      offset = *pvVar5 * i_1 + offset;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dims,(long)local_84);
      i_1 = *pvVar5 * i_1;
    }
  }
  else {
    for (uStack_80 = 0;
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_dims),
        uStack_80 < sVar3; uStack_80 = uStack_80 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                          uStack_80);
      offset = *pvVar5 * i_1 + offset;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_dims,uStack_80);
      i_1 = *pvVar5 * i_1;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return offset;
}

Assistant:

size_t convert(std::map<size_t, size_t>& config) {
		// The source variables are a subset of the config vector

		std::vector<size_t> values;
		values.resize(m_vars.size());
		for (size_t i = 0; i < m_vars.size(); ++i) {
			size_t var = m_vars[i].label();
			std::map<size_t, size_t>::iterator mi = config.find(var);
			if (mi != config.end()) {
				size_t val = mi->second;
				values[i] = val;
			}
		}

		// Safety checks
		assert(values.size() == m_vars.size());

		size_t index = 0, offset = 1;
		if (m_bigendian) { // start from the first variable
			for (size_t i = 0; i < m_dims.size(); ++i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		} else {
			for (int i = m_dims.size()-1; i >= 0; --i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		}

		return index;
	}